

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O0

void UTF_fgets_test(char *fname)

{
  int iVar1;
  FILE *__stream;
  char16_t *pcVar2;
  size_t sVar3;
  UTF_UC16 *pUVar4;
  UTF_C8 local_118 [8];
  UTF_C8 buf2 [128];
  UTF_UC16 buf [64];
  FILE *fp;
  char *fname_local;
  
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    UTF_test(0x5a,false);
  }
  else {
    pcVar2 = UTF_fgets<char16_t>((char16_t *)(buf2 + 0x78),0x40,(FILE *)__stream);
    UTF_test(0x5e,pcVar2 == (char16_t *)(buf2 + 0x78));
    iVar1 = UTF_uj16_cmp((UTF_UC16 *)(buf2 + 0x78),L"TEST\n");
    UTF_test(0x5f,iVar1 == 0);
    sVar3 = UTF_uj16_len((UTF_UC16 *)(buf2 + 0x78));
    UTF_uj16_to_j8((UTF_UC16 *)(buf2 + 0x78),sVar3 + 1,local_118,0x80);
    iVar1 = UTF_j8_cmp(local_118,"TEST\n");
    UTF_test(0x61,iVar1 == 0);
    pcVar2 = UTF_fgets<char16_t>((char16_t *)(buf2 + 0x78),0x40,(FILE *)__stream);
    UTF_test(99,pcVar2 == (char16_t *)(buf2 + 0x78));
    iVar1 = UTF_uj16_cmp((UTF_UC16 *)(buf2 + 0x78),L"ABC123\n");
    UTF_test(100,iVar1 == 0);
    sVar3 = UTF_uj16_len((UTF_UC16 *)(buf2 + 0x78));
    UTF_uj16_to_j8((UTF_UC16 *)(buf2 + 0x78),sVar3 + 1,local_118,0x80);
    iVar1 = UTF_j8_cmp(local_118,"ABC123\n");
    UTF_test(0x66,iVar1 == 0);
    pUVar4 = UTF16_fgets((UTF_UC16 *)(buf2 + 0x78),0x40,(FILE *)__stream);
    UTF_test(0x68,pUVar4 == (UTF_UC16 *)(buf2 + 0x78));
    iVar1 = UTF_uj16_cmp((UTF_UC16 *)(buf2 + 0x78),L"あいうえお\n");
    UTF_test(0x69,iVar1 == 0);
    sVar3 = UTF_uj16_len((UTF_UC16 *)(buf2 + 0x78));
    UTF_uj16_to_j8((UTF_UC16 *)(buf2 + 0x78),sVar3 + 1,local_118,0x80);
    iVar1 = UTF_j8_cmp(local_118,anon_var_dwarf_4983);
    UTF_test(0x6b,iVar1 == 0);
    pcVar2 = UTF_fgets<char16_t>((char16_t *)(buf2 + 0x78),0x40,(FILE *)__stream);
    UTF_test(0x6d,pcVar2 == (char16_t *)(buf2 + 0x78));
    iVar1 = UTF_uj16_cmp((UTF_UC16 *)(buf2 + 0x78),L"漢字\n");
    UTF_test(0x6e,iVar1 == 0);
    sVar3 = UTF_uj16_len((UTF_UC16 *)(buf2 + 0x78));
    UTF_uj16_to_j8((UTF_UC16 *)(buf2 + 0x78),sVar3 + 1,local_118,0x80);
    iVar1 = UTF_j8_cmp(local_118,anon_var_dwarf_49af);
    UTF_test(0x70,iVar1 == 0);
    pcVar2 = UTF_fgets<char16_t>((char16_t *)(buf2 + 0x78),0x40,(FILE *)__stream);
    UTF_test(0x72,pcVar2 == (char16_t *)0x0);
    fclose(__stream);
  }
  return;
}

Assistant:

void UTF_fgets_test(const char *fname)
{
    FILE *fp;
    UTF_UC16 buf[64];
    UTF_C8 buf2[128];

    fp = fopen(fname, "rb");
    if (!fp)
    {
        UTF_test(__LINE__, fp != NULL);
        return;
    }

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("TEST\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, UTF_u8("TEST\n")) == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("ABC123\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, UTF_u8("ABC123\n")) == 0);

    UTF_test(__LINE__, UTF16_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("\u3042\u3044\u3046\u3048\u304A\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, "\xE3\x81\x82\xE3\x81\x84\xE3\x81\x86\xE3\x81\x88\xE3\x81\x8A\n") == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("\u6F22\u5B57\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, "\xE6\xBC\xA2\xE5\xAD\x97\n") == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == NULL);

    fclose(fp);
}